

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructArgs
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t array_count)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  char *nameprefix_00;
  size_t local_158;
  string local_148;
  ulong local_128;
  size_t i;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_t local_90;
  size_t array_cnt;
  StructDef *local_80;
  EnumDef *local_78;
  uint16_t local_70;
  Type *local_68;
  Type *type;
  Type *pTStack_58;
  bool array_field;
  Type *field_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_40;
  const_iterator it;
  string *code;
  size_t array_count_local;
  char *nameprefix_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_40._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_40);
    field_type = (Type *)*ppFVar2;
    pTStack_58 = &(((FieldDef *)field_type)->value).type;
    type._7_1_ = IsArray(pTStack_58);
    if ((bool)type._7_1_) {
      Type::VectorType((Type *)&array_cnt,pTStack_58);
    }
    else {
      array_cnt._0_4_ = pTStack_58->base_type;
      array_cnt._4_4_ = pTStack_58->element;
      local_80 = pTStack_58->struct_def;
      local_78 = pTStack_58->enum_def;
      local_70 = pTStack_58->fixed_length;
    }
    local_68 = (Type *)&array_cnt;
    local_158 = array_count;
    if ((type._7_1_ & 1) != 0) {
      local_158 = array_count + 1;
    }
    local_90 = local_158;
    bVar1 = IsStruct(local_68);
    if (bVar1) {
      struct_def_00 = pTStack_58->struct_def;
      EscapeKeyword(&local_f0,this,(string *)field_type);
      std::operator+(&local_d0,&local_f0,"_");
      std::operator+(&local_b0,nameprefix,&local_d0);
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      GenStructArgs(this,struct_def_00,code_ptr,nameprefix_00,local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      std::__cxx11::string::operator+=((string *)it._M_current,", ");
      GenTypeBasic_abi_cxx11_((string *)&i,this,local_68);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      bVar1 = FieldDef::IsScalarOptional((FieldDef *)field_type);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)it._M_current,"?");
      }
      if (local_90 != 0) {
        std::__cxx11::string::operator+=((string *)it._M_current,"[");
        for (local_128 = 1; local_128 < local_90; local_128 = local_128 + 1) {
          std::__cxx11::string::operator+=((string *)it._M_current,",");
        }
        std::__cxx11::string::operator+=((string *)it._M_current,"]");
      }
      std::__cxx11::string::operator+=((string *)it._M_current," ");
      std::__cxx11::string::operator+=((string *)it._M_current,nameprefix);
      Name_abi_cxx11_(&local_148,this,(FieldDef *)field_type);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void GenStructArgs(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t array_count = 0) const {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto array_field = IsArray(field_type);
      const auto &type = array_field ? field_type.VectorType() : field_type;
      const auto array_cnt = array_field ? (array_count + 1) : array_count;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(*field_type.struct_def, code_ptr,
                      (nameprefix + (EscapeKeyword(field.name) + "_")).c_str(),
                      array_cnt);
      } else {
        code += ", ";
        code += GenTypeBasic(type);
        if (field.IsScalarOptional()) { code += "?"; }
        if (array_cnt > 0) {
          code += "[";
          for (size_t i = 1; i < array_cnt; i++) code += ",";
          code += "]";
        }
        code += " ";
        code += nameprefix;
        code += Name(field);
      }
    }
  }